

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_null_req(void)

{
  int iVar1;
  undefined8 uVar2;
  
  iVar1 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0,0,(uv_fs_cb)0x0);
  if (iVar1 == -0x16) {
    iVar1 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,(uv_fs_cb)0x0);
    if (iVar1 == -0x16) {
      iVar1 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,(uv_buf_t *)0x0,0,-1,(uv_fs_cb)0x0);
      if (iVar1 == -0x16) {
        iVar1 = uv_fs_write((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,(uv_buf_t *)0x0,0,-1,(uv_fs_cb)0x0);
        if (iVar1 == -0x16) {
          iVar1 = uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
          if (iVar1 == -0x16) {
            iVar1 = uv_fs_mkdir((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0,(uv_fs_cb)0x0);
            if (iVar1 == -0x16) {
              iVar1 = uv_fs_mkdtemp((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
              if (iVar1 == -0x16) {
                iVar1 = uv_fs_mkstemp((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
                if (iVar1 == -0x16) {
                  iVar1 = uv_fs_rmdir((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
                  if (iVar1 == -0x16) {
                    iVar1 = uv_fs_scandir((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0,
                                          (uv_fs_cb)0x0);
                    if (iVar1 == -0x16) {
                      iVar1 = uv_fs_link((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(char *)0x0,
                                         (uv_fs_cb)0x0);
                      if (iVar1 == -0x16) {
                        iVar1 = uv_fs_symlink((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,
                                              (char *)0x0,0,(uv_fs_cb)0x0);
                        if (iVar1 == -0x16) {
                          iVar1 = uv_fs_readlink((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,
                                                 (uv_fs_cb)0x0);
                          if (iVar1 == -0x16) {
                            iVar1 = uv_fs_realpath((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,
                                                   (uv_fs_cb)0x0);
                            if (iVar1 == -0x16) {
                              iVar1 = uv_fs_chown((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0,0,
                                                  (uv_fs_cb)0x0);
                              if (iVar1 == -0x16) {
                                iVar1 = uv_fs_fchown((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,0,0,
                                                     (uv_fs_cb)0x0);
                                if (iVar1 == -0x16) {
                                  iVar1 = uv_fs_stat((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,
                                                     (uv_fs_cb)0x0);
                                  if (iVar1 == -0x16) {
                                    iVar1 = uv_fs_lstat((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,
                                                        (uv_fs_cb)0x0);
                                    if (iVar1 == -0x16) {
                                      iVar1 = uv_fs_fstat((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,
                                                          (uv_fs_cb)0x0);
                                      if (iVar1 == -0x16) {
                                        iVar1 = uv_fs_rename((uv_loop_t *)0x0,(uv_fs_t *)0x0,
                                                             (char *)0x0,(char *)0x0,(uv_fs_cb)0x0);
                                        if (iVar1 == -0x16) {
                                          iVar1 = uv_fs_fsync((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,
                                                              (uv_fs_cb)0x0);
                                          if (iVar1 == -0x16) {
                                            iVar1 = uv_fs_fdatasync((uv_loop_t *)0x0,(uv_fs_t *)0x0,
                                                                    0,(uv_fs_cb)0x0);
                                            if (iVar1 == -0x16) {
                                              iVar1 = uv_fs_ftruncate((uv_loop_t *)0x0,
                                                                      (uv_fs_t *)0x0,0,0,
                                                                      (uv_fs_cb)0x0);
                                              if (iVar1 == -0x16) {
                                                iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,
                                                                       (uv_fs_t *)0x0,(char *)0x0,
                                                                       (char *)0x0,0,(uv_fs_cb)0x0);
                                                if (iVar1 == -0x16) {
                                                  iVar1 = uv_fs_sendfile((uv_loop_t *)0x0,
                                                                         (uv_fs_t *)0x0,0,0,0,0,
                                                                         (uv_fs_cb)0x0);
                                                  if (iVar1 == -0x16) {
                                                    iVar1 = uv_fs_access((uv_loop_t *)0x0,
                                                                         (uv_fs_t *)0x0,(char *)0x0,
                                                                         0,(uv_fs_cb)0x0);
                                                    if (iVar1 == -0x16) {
                                                      iVar1 = uv_fs_chmod((uv_loop_t *)0x0,
                                                                          (uv_fs_t *)0x0,(char *)0x0
                                                                          ,0,(uv_fs_cb)0x0);
                                                      if (iVar1 == -0x16) {
                                                        iVar1 = uv_fs_fchmod((uv_loop_t *)0x0,
                                                                             (uv_fs_t *)0x0,0,0,
                                                                             (uv_fs_cb)0x0);
                                                        if (iVar1 == -0x16) {
                                                          iVar1 = uv_fs_utime((uv_loop_t *)0x0,
                                                                              (uv_fs_t *)0x0,
                                                                              (char *)0x0,0.0,0.0,
                                                                              (uv_fs_cb)0x0);
                                                          if (iVar1 == -0x16) {
                                                            iVar1 = uv_fs_futime((uv_loop_t *)0x0,
                                                                                 (uv_fs_t *)0x0,0,
                                                                                 0.0,0.0,(uv_fs_cb)
                                                                                         0x0);
                                                            if (iVar1 == -0x16) {
                                                              iVar1 = uv_fs_statfs((uv_loop_t *)0x0,
                                                                                   (uv_fs_t *)0x0,
                                                                                   (char *)0x0,
                                                                                   (uv_fs_cb)0x0);
                                                              if (iVar1 == -0x16) {
                                                                uv_fs_req_cleanup((uv_fs_t *)0x0);
                                                                return 0;
                                                              }
                                                              uVar2 = 0xf83;
                                                            }
                                                            else {
                                                              uVar2 = 0xf80;
                                                            }
                                                          }
                                                          else {
                                                            uVar2 = 0xf7d;
                                                          }
                                                        }
                                                        else {
                                                          uVar2 = 0xf7a;
                                                        }
                                                      }
                                                      else {
                                                        uVar2 = 0xf77;
                                                      }
                                                    }
                                                    else {
                                                      uVar2 = 0xf74;
                                                    }
                                                  }
                                                  else {
                                                    uVar2 = 0xf71;
                                                  }
                                                }
                                                else {
                                                  uVar2 = 0xf6e;
                                                }
                                              }
                                              else {
                                                uVar2 = 0xf6b;
                                              }
                                            }
                                            else {
                                              uVar2 = 0xf68;
                                            }
                                          }
                                          else {
                                            uVar2 = 0xf65;
                                          }
                                        }
                                        else {
                                          uVar2 = 0xf62;
                                        }
                                      }
                                      else {
                                        uVar2 = 0xf5f;
                                      }
                                    }
                                    else {
                                      uVar2 = 0xf5c;
                                    }
                                  }
                                  else {
                                    uVar2 = 0xf59;
                                  }
                                }
                                else {
                                  uVar2 = 0xf56;
                                }
                              }
                              else {
                                uVar2 = 0xf53;
                              }
                            }
                            else {
                              uVar2 = 0xf50;
                            }
                          }
                          else {
                            uVar2 = 0xf4d;
                          }
                        }
                        else {
                          uVar2 = 0xf4a;
                        }
                      }
                      else {
                        uVar2 = 0xf47;
                      }
                    }
                    else {
                      uVar2 = 0xf44;
                    }
                  }
                  else {
                    uVar2 = 0xf41;
                  }
                }
                else {
                  uVar2 = 0xf3e;
                }
              }
              else {
                uVar2 = 0xf3b;
              }
            }
            else {
              uVar2 = 0xf38;
            }
          }
          else {
            uVar2 = 0xf35;
          }
        }
        else {
          uVar2 = 0xf32;
        }
      }
      else {
        uVar2 = 0xf2f;
      }
    }
    else {
      uVar2 = 0xf2c;
    }
  }
  else {
    uVar2 = 0xf29;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar2,"r == UV_EINVAL");
  abort();
}

Assistant:

TEST_IMPL(fs_null_req) {
  /* Verify that all fs functions return UV_EINVAL when the request is NULL. */
  int r;

  r = uv_fs_open(NULL, NULL, NULL, 0, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_close(NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_read(NULL, NULL, 0, NULL, 0, -1, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_write(NULL, NULL, 0, NULL, 0, -1, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_unlink(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_mkdir(NULL, NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_mkdtemp(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_mkstemp(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_rmdir(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_scandir(NULL, NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_link(NULL, NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_symlink(NULL, NULL, NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_readlink(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_realpath(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_chown(NULL, NULL, NULL, 0, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_fchown(NULL, NULL, 0, 0, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_stat(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_lstat(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_fstat(NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_rename(NULL, NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_fsync(NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_fdatasync(NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_ftruncate(NULL, NULL, 0, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_copyfile(NULL, NULL, NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_sendfile(NULL, NULL, 0, 0, 0, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_access(NULL, NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_chmod(NULL, NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_fchmod(NULL, NULL, 0, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_utime(NULL, NULL, NULL, 0.0, 0.0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_futime(NULL, NULL, 0, 0.0, 0.0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_statfs(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  /* This should be a no-op. */
  uv_fs_req_cleanup(NULL);

  return 0;
}